

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<9,_0,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Matrix<float,_3,_3> *mat;
  MatrixCaseUtils local_cc [12];
  MatrixCaseUtils local_c0 [12];
  tcu local_b4 [12];
  VecAccess<float,_4,_3> local_a8;
  MatrixCaseUtils local_8c [36];
  Matrix<float,_3,_3> local_68;
  Matrix<float,_3,_3> local_44;
  
  tcu::Matrix<float,_3,_3>::Matrix(&local_44,(Matrix<float,_3,_3> *)s_constInMat3);
  reduceToVec3(local_c0,&local_44);
  tcu::Matrix<float,_3,_3>::Matrix
            ((Matrix<float,_3,_3> *)local_8c,(Matrix<float,_3,_3> *)s_constInMat3);
  increment<float,3,3>(&local_68,local_8c,mat);
  reduceToVec3(local_cc,&local_68);
  tcu::operator+(local_b4,(Vector<float,_3> *)local_c0,(Vector<float,_3> *)local_cc);
  local_a8.m_vector = &evalCtx->color;
  local_a8.m_index[0] = 0;
  local_a8.m_index[1] = 1;
  local_a8.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_a8,(Vector<float,_3> *)local_b4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}